

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

NativeOffsetMap __thiscall
JsUtil::
List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
::RemoveAtEnd(List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  NativeOffsetMap NVar5;
  List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_local;
  NativeOffsetMap item;
  
  if ((this->
      super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
      ).count < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                       ,0x1d2,"(this->count >= 1)","this->count >= 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pTVar4 = Item(this,(this->
                     super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
                     ).count + -1);
  RemoveAt(this,(this->
                super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
                ).count + -1);
  NVar5.statementIndex = pTVar4->statementIndex;
  NVar5.nativeOffsetSpan = pTVar4->nativeOffsetSpan;
  return NVar5;
}

Assistant:

T RemoveAtEnd()
        {
            Assert(this->count >= 1);
            T item = this->Item(this->count - 1);
            RemoveAt(this->count - 1);
            return item;
        }